

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  __pid_t _Var9;
  uint uVar10;
  uint uVar11;
  uint64_t uVar12;
  longlong lVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  char *endptr;
  addrinfo *res;
  addrinfo local_68;
  addrinfo *local_38;
  
  uVar10 = bufferSizeMilliseconds;
  uVar2 = clockMicros;
  uVar3 = clockPeripheral;
  uVar4 = DMAprimaryChannel;
  uVar5 = DMAsecondaryChannel;
  uVar6 = socketPort;
  uVar7 = memAllocMode;
  uVar1 = cfgInternals;
LAB_001024e6:
  do {
    cfgInternals = uVar1;
    memAllocMode = uVar7;
    socketPort = uVar6;
    DMAsecondaryChannel = uVar5;
    DMAprimaryChannel = uVar4;
    clockPeripheral = uVar3;
    clockMicros = uVar2;
    bufferSizeMilliseconds = uVar10;
    iVar8 = getopt(argc,argv,"a:b:c:d:e:fgkln:mp:s:t:x:vV");
    pcVar15 = _optarg;
    uVar10 = bufferSizeMilliseconds;
    uVar2 = clockMicros;
    uVar3 = clockPeripheral;
    uVar4 = DMAprimaryChannel;
    uVar5 = DMAsecondaryChannel;
    uVar6 = socketPort;
    uVar7 = memAllocMode;
    uVar1 = cfgInternals;
    switch(iVar8) {
    case 0x56:
    case 0x76:
      printf("%d\n",0x49);
LAB_001029c7:
      exit(0);
    case 0x61:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ == '\0') {
        uVar10 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = uVar11;
        uVar1 = cfgInternals;
        if (uVar11 < 3) break;
      }
      else {
        uVar11 = 0xffffffff;
      }
      pcVar15 = "invalid -a option (%d)";
      goto LAB_00102a53;
    case 0x62:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ != '\0') goto LAB_001029d3;
      uVar10 = uVar11;
      uVar2 = clockMicros;
      uVar3 = clockPeripheral;
      uVar4 = DMAprimaryChannel;
      uVar5 = DMAsecondaryChannel;
      uVar6 = socketPort;
      uVar7 = memAllocMode;
      uVar1 = cfgInternals;
      if (0x26ac < uVar11 - 100) goto LAB_001029d8;
      break;
    case 99:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ == '\0') {
        uVar10 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar1 = uVar11;
        if (uVar11 < 0x800) break;
      }
      else {
        uVar11 = 0xffffffff;
      }
      pcVar15 = "invalid -c option (%x)";
      goto LAB_00102a53;
    case 100:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ != '\0') goto LAB_00102a2b;
      uVar10 = bufferSizeMilliseconds;
      uVar2 = clockMicros;
      uVar3 = clockPeripheral;
      uVar4 = uVar11;
      uVar5 = DMAsecondaryChannel;
      uVar6 = socketPort;
      uVar7 = memAllocMode;
      uVar1 = cfgInternals;
      if (0xf < uVar11) goto LAB_00102a30;
      break;
    case 0x65:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ == '\0') {
        uVar10 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = uVar11;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar1 = cfgInternals;
        if (uVar11 < 0x10) break;
      }
      else {
        uVar11 = 0xffffffff;
      }
      pcVar15 = "invalid -e option (%d)";
      goto LAB_00102a53;
    case 0x66:
      ifFlags = ifFlags | 1;
      break;
    case 0x67:
      foreground = '\x01';
      break;
    case 0x6b:
      ifFlags = ifFlags | 2;
      break;
    case 0x6c:
      ifFlags = ifFlags | 4;
      break;
    case 0x6d:
      ifFlags = ifFlags | 8;
      break;
    case 0x6e:
      pcVar16 = getenv("PIGPIO_PORT");
      if (pcVar16 == (char *)0x0) {
        pcVar16 = "8888";
      }
      local_68.ai_addrlen = 0;
      local_68._20_4_ = 0;
      local_68.ai_addr = (sockaddr *)0x0;
      local_68.ai_canonname = (char *)0x0;
      local_68.ai_next = (addrinfo *)0x0;
      local_68.ai_socktype = 1;
      local_68.ai_protocol = 0;
      local_68._0_8_ = (char *)0x200000002;
      iVar8 = getaddrinfo(pcVar15,pcVar16,&local_68,&local_38);
      if (iVar8 == 0) {
        uVar1 = *(uint32_t *)(local_38->ai_addr->sa_data + 2);
        freeaddrinfo(local_38);
        if ((uVar1 != 0) && (numSockNetAddr < 0x100)) {
          lVar14 = (long)numSockNetAddr;
          numSockNetAddr = numSockNetAddr + 1;
          sockNetAddr[lVar14] = uVar1;
          uVar10 = bufferSizeMilliseconds;
          uVar2 = clockMicros;
          uVar3 = clockPeripheral;
          uVar4 = DMAprimaryChannel;
          uVar5 = DMAsecondaryChannel;
          uVar6 = socketPort;
          uVar7 = memAllocMode;
          uVar1 = cfgInternals;
          break;
        }
      }
      pcVar16 = "invalid -n option (%s)";
      pcVar15 = _optarg;
      goto LAB_00102a24;
    case 0x70:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ == '\0') {
        uVar10 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = uVar11;
        uVar7 = memAllocMode;
        uVar1 = cfgInternals;
        if (uVar11 - 0x400 < 0x7901) break;
      }
      else {
        uVar11 = 0xffffffff;
      }
      pcVar15 = "invalid -p option (%d)";
      goto LAB_00102a53;
    case 0x73:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ == '\0') {
        if ((uVar11 < 0xb) &&
           (uVar10 = bufferSizeMilliseconds, uVar2 = uVar11, uVar3 = clockPeripheral,
           uVar4 = DMAprimaryChannel, uVar5 = DMAsecondaryChannel, uVar6 = socketPort,
           uVar7 = memAllocMode, uVar1 = cfgInternals, (0x536U >> (uVar11 & 0x1f) & 1) != 0)) break;
      }
      else {
        uVar11 = 0xffffffff;
      }
      pcVar15 = "invalid -s option (%d)";
      goto LAB_00102a53;
    case 0x74:
      lVar13 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = (uint)lVar13;
      if (*(char *)local_68._0_8_ == '\0') goto code_r0x001026f2;
      uVar11 = 0xffffffff;
      goto LAB_00102a10;
    case 0x78:
      uVar12 = strtoll(_optarg,(char **)&local_68,0);
      if (*(char *)local_68._0_8_ != '\0') {
        pcVar16 = "invalid -x option (%s)";
        pcVar15 = _optarg;
LAB_00102a24:
        fatal(pcVar16,pcVar15);
LAB_00102a2b:
        uVar11 = 0xffffffff;
LAB_00102a30:
        pcVar15 = "invalid -d option (%d)";
        goto LAB_00102a53;
      }
      updateMaskSet = '\x01';
      uVar10 = bufferSizeMilliseconds;
      uVar2 = clockMicros;
      uVar3 = clockPeripheral;
      uVar4 = DMAprimaryChannel;
      uVar5 = DMAsecondaryChannel;
      uVar6 = socketPort;
      updateMask = uVar12;
      uVar7 = memAllocMode;
      uVar1 = cfgInternals;
      break;
    default:
      if (iVar8 == -1) {
        if (foreground == '\0') {
          _Var9 = fork();
          if (_Var9 < 0) {
            exit(1);
          }
          if (_Var9 != 0) goto LAB_001029c7;
          umask(0);
          _Var9 = setsid();
          if (_Var9 < 0) {
            pcVar15 = "setsid failed (%m)";
            goto LAB_00102a8f;
          }
          iVar8 = chdir("/");
          if (iVar8 < 0) {
            pcVar15 = "chdir failed (%m)";
            goto LAB_00102a8f;
          }
          fclose(_stdin);
          fclose(_stdout);
        }
        gpioCfgBufferSize(bufferSizeMilliseconds);
        gpioCfgClock(clockMicros,clockPeripheral,0);
        gpioCfgInterfaces(ifFlags);
        gpioCfgDMAchannels(DMAprimaryChannel,DMAsecondaryChannel);
        gpioCfgSocketPort(socketPort);
        gpioCfgMemAlloc(memAllocMode);
        if (updateMaskSet == '\x01') {
          gpioCfgPermissions(updateMask);
        }
        gpioCfgNetAddr(numSockNetAddr,sockNetAddr);
        gpioCfgSetInternals(cfgInternals);
        iVar8 = gpioInitialise();
        if (-1 < iVar8) {
          unlink("/dev/pigerr");
          mkfifo("/dev/pigerr",0x1b4);
          iVar8 = chmod("/dev/pigerr",0x1b4);
          if (-1 < iVar8) {
            errFifo = (FILE *)freopen("/dev/pigerr","w+",_stderr);
            if ((FILE *)errFifo == (FILE *)0x0) {
              main_cold_1();
              return 0;
            }
            iVar8 = fileno((FILE *)errFifo);
            uVar10 = fcntl(iVar8,3,0);
            iVar8 = fileno((FILE *)errFifo);
            fcntl(iVar8,4,(ulong)(uVar10 | 0x800));
            gpioSetSignalFunc(1,terminate);
            gpioSetSignalFunc(0xf,terminate);
            do {
              sleep(5);
              fflush((FILE *)errFifo);
            } while( true );
          }
          pcVar16 = "chmod %s failed (%m)";
          pcVar15 = "/dev/pigerr";
          goto LAB_00102a24;
        }
        goto LAB_00102a5c;
      }
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x77:
      main_cold_2();
LAB_001029d3:
      uVar11 = 0xffffffff;
LAB_001029d8:
      pcVar15 = "invalid -b option (%d)";
      goto LAB_00102a53;
    }
  } while( true );
code_r0x001026f2:
  uVar10 = bufferSizeMilliseconds;
  uVar2 = clockMicros;
  uVar3 = uVar11;
  uVar4 = DMAprimaryChannel;
  uVar5 = DMAsecondaryChannel;
  uVar6 = socketPort;
  uVar7 = memAllocMode;
  uVar1 = cfgInternals;
  if (1 < uVar11) {
LAB_00102a10:
    pcVar15 = "invalid -t option (%d)";
LAB_00102a53:
    fatal(pcVar15,(ulong)uVar11);
LAB_00102a5c:
    pcVar15 = "Can\'t initialise pigpio library";
LAB_00102a8f:
    fatal(pcVar15);
    halt_baddata();
  }
  goto LAB_001024e6;
}

Assistant:

int main(int argc, char **argv)
{
   pid_t pid;
   int flags;

   /* check command line parameters */

   initOpts(argc, argv);

   if (!foreground) {
      /* Fork off the parent process */

      pid = fork();

      if (pid < 0) { exit(EXIT_FAILURE); }

      /* If we got a good PID, then we can exit the parent process. */

      if (pid > 0) { exit(EXIT_SUCCESS); }

      /* Change the file mode mask */

      umask(0);

      /* Open any logs here */

      /* NONE */

      /* Create a new SID for the child process */

      if (setsid() < 0) fatal("setsid failed (%m)");

      /* Change the current working directory */

      if ((chdir("/")) < 0) fatal("chdir failed (%m)");

      /* Close out the standard file descriptors */

      fclose(stdin);
      fclose(stdout);
   }

   /* configure library */

   gpioCfgBufferSize(bufferSizeMilliseconds);

   gpioCfgClock(clockMicros, clockPeripheral, 0);

   gpioCfgInterfaces(ifFlags);

   gpioCfgDMAchannels(DMAprimaryChannel, DMAsecondaryChannel);

   gpioCfgSocketPort(socketPort);

   gpioCfgMemAlloc(memAllocMode);

   if (updateMaskSet) gpioCfgPermissions(updateMask);

   gpioCfgNetAddr(numSockNetAddr, sockNetAddr);

   gpioCfgSetInternals(cfgInternals);

   /* start library */

   if (gpioInitialise()< 0) fatal("Can't initialise pigpio library");

   /* create pipe for error reporting */

   unlink(PI_ERRFIFO);

   mkfifo(PI_ERRFIFO, 0664);

   if (chmod(PI_ERRFIFO, 0664) < 0)
      fatal("chmod %s failed (%m)", PI_ERRFIFO);

   errFifo = freopen(PI_ERRFIFO, "w+", stderr);

   if (errFifo)
   {
      /* set stderr non-blocking */

      flags = fcntl(fileno(errFifo), F_GETFL, 0);
      fcntl(fileno(errFifo), F_SETFL, flags | O_NONBLOCK);

      /* request SIGHUP/SIGTERM from libarary for termination */

      gpioSetSignalFunc(SIGHUP, terminate);
      gpioSetSignalFunc(SIGTERM, terminate);

      /* sleep forever */

      while (1)
      {
         /* cat /dev/pigerr to view daemon errors */

         sleep(5);

         fflush(errFifo);
      }
   }
   else
   {
      fprintf(stderr, "freopen failed (%m)");

      gpioTerminate();
   }

   return 0;
}